

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

double duckdb::Log2Operator::Operation<double,double>(double input)

{
  OutOfRangeException *pOVar1;
  double dVar2;
  string local_40;
  
  if (input < 0.0) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"cannot take logarithm of a negative number","");
    OutOfRangeException::OutOfRangeException(pOVar1,&local_40);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((input == 0.0) && (!NAN(input))) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"cannot take logarithm of zero","");
    OutOfRangeException::OutOfRangeException(pOVar1,&local_40);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  dVar2 = log2(input);
  return dVar2;
}

Assistant:

static inline TR Operation(TA input) {
		if (input < 0) {
			throw OutOfRangeException("cannot take logarithm of a negative number");
		}
		if (input == 0) {
			throw OutOfRangeException("cannot take logarithm of zero");
		}
		return std::log2(input);
	}